

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueFederateExport.cpp
# Opt level: O0

HelicsInput anon_unknown.dwarf_5d1c2::findOrCreateInput(HelicsFederate fed,Input *input)

{
  bool bVar1;
  pointer pIVar2;
  Input *in_RSI;
  unique_ptr<helics::InputObject,_std::default_delete<helics::InputObject>_> *in_RDI;
  __single_object inp;
  HelicsInput hinp;
  __normal_iterator<std::unique_ptr<helics::InputObject,_std::default_delete<helics::InputObject>_>_*,_std::vector<std::unique_ptr<helics::InputObject,_std::default_delete<helics::InputObject>_>,_std::allocator<std::unique_ptr<helics::InputObject,_std::default_delete<helics::InputObject>_>_>_>_>
  ind;
  InterfaceHandle handle;
  FedObject *fedObj;
  vector<std::unique_ptr<helics::InputObject,_std::default_delete<helics::InputObject>_>,_std::allocator<std::unique_ptr<helics::InputObject,_std::default_delete<helics::InputObject>_>_>_>
  *in_stack_ffffffffffffff28;
  __normal_iterator<std::unique_ptr<helics::InputObject,_std::default_delete<helics::InputObject>_>_*,_std::vector<std::unique_ptr<helics::InputObject,_std::default_delete<helics::InputObject>_>,_std::allocator<std::unique_ptr<helics::InputObject,_std::default_delete<helics::InputObject>_>_>_>_>
  *in_stack_ffffffffffffff30;
  shared_ptr<helics::ValueFederate> *this;
  HelicsError *in_stack_ffffffffffffff40;
  HelicsFederate in_stack_ffffffffffffff48;
  bool local_91;
  element_type *in_stack_ffffffffffffff88;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_stack_ffffffffffffff90;
  InterfaceHandle local_54;
  unique_ptr<helics::InputObject,_std::default_delete<helics::InputObject>_> *local_50;
  unique_ptr<helics::InputObject,_std::default_delete<helics::InputObject>_> *local_40;
  unique_ptr<helics::InputObject,_std::default_delete<helics::InputObject>_> *local_38;
  __normal_iterator<std::unique_ptr<helics::InputObject,_std::default_delete<helics::InputObject>_>_*,_std::vector<std::unique_ptr<helics::InputObject,_std::default_delete<helics::InputObject>_>,_std::allocator<std::unique_ptr<helics::InputObject,_std::default_delete<helics::InputObject>_>_>_>_>
  local_30;
  InterfaceHandle local_24 [3];
  Input *local_18;
  unique_ptr<helics::InputObject,_std::default_delete<helics::InputObject>_> *local_10;
  pointer local_8;
  
  local_18 = in_RSI;
  local_10 = in_RDI;
  local_24[0] = helics::Interface::getHandle(&in_RSI->super_Interface);
  local_38 = (unique_ptr<helics::InputObject,_std::default_delete<helics::InputObject>_> *)
             std::
             vector<std::unique_ptr<helics::InputObject,_std::default_delete<helics::InputObject>_>,_std::allocator<std::unique_ptr<helics::InputObject,_std::default_delete<helics::InputObject>_>_>_>
             ::begin(in_stack_ffffffffffffff28);
  local_40 = (unique_ptr<helics::InputObject,_std::default_delete<helics::InputObject>_> *)
             std::
             vector<std::unique_ptr<helics::InputObject,_std::default_delete<helics::InputObject>_>,_std::allocator<std::unique_ptr<helics::InputObject,_std::default_delete<helics::InputObject>_>_>_>
             ::end(in_stack_ffffffffffffff28);
  local_30 = std::
             upper_bound<__gnu_cxx::__normal_iterator<std::unique_ptr<helics::InputObject,std::default_delete<helics::InputObject>>*,std::vector<std::unique_ptr<helics::InputObject,std::default_delete<helics::InputObject>>,std::allocator<std::unique_ptr<helics::InputObject,std::default_delete<helics::InputObject>>>>>,helics::InterfaceHandle,(anonymous_namespace)::__0>
                       (local_38,local_40,local_24);
  local_50 = (unique_ptr<helics::InputObject,_std::default_delete<helics::InputObject>_> *)
             std::
             vector<std::unique_ptr<helics::InputObject,_std::default_delete<helics::InputObject>_>,_std::allocator<std::unique_ptr<helics::InputObject,_std::default_delete<helics::InputObject>_>_>_>
             ::end(in_stack_ffffffffffffff28);
  bVar1 = __gnu_cxx::
          operator==<std::unique_ptr<helics::InputObject,_std::default_delete<helics::InputObject>_>_*,_std::vector<std::unique_ptr<helics::InputObject,_std::default_delete<helics::InputObject>_>,_std::allocator<std::unique_ptr<helics::InputObject,_std::default_delete<helics::InputObject>_>_>_>_>
                    (in_stack_ffffffffffffff30,
                     (__normal_iterator<std::unique_ptr<helics::InputObject,_std::default_delete<helics::InputObject>_>_*,_std::vector<std::unique_ptr<helics::InputObject,_std::default_delete<helics::InputObject>_>,_std::allocator<std::unique_ptr<helics::InputObject,_std::default_delete<helics::InputObject>_>_>_>_>
                      *)in_stack_ffffffffffffff28);
  local_91 = false;
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    __gnu_cxx::
    __normal_iterator<std::unique_ptr<helics::InputObject,_std::default_delete<helics::InputObject>_>_*,_std::vector<std::unique_ptr<helics::InputObject,_std::default_delete<helics::InputObject>_>,_std::allocator<std::unique_ptr<helics::InputObject,_std::default_delete<helics::InputObject>_>_>_>_>
    ::operator*(&local_30);
    pIVar2 = std::unique_ptr<helics::InputObject,_std::default_delete<helics::InputObject>_>::
             operator->((unique_ptr<helics::InputObject,_std::default_delete<helics::InputObject>_>
                         *)0x1cdde7);
    local_54 = helics::Interface::getHandle(&pIVar2->inputPtr->super_Interface);
    local_91 = helics::InterfaceHandle::operator==(&local_54,local_24[0]);
  }
  if (local_91 == false) {
    std::make_unique<helics::InputObject>();
    pIVar2 = std::unique_ptr<helics::InputObject,_std::default_delete<helics::InputObject>_>::
             operator->((unique_ptr<helics::InputObject,_std::default_delete<helics::InputObject>_>
                         *)0x1cde79);
    pIVar2->inputPtr = local_18;
    getValueFedSharedPtr(in_stack_ffffffffffffff48,in_stack_ffffffffffffff40);
    std::unique_ptr<helics::InputObject,_std::default_delete<helics::InputObject>_>::operator->
              ((unique_ptr<helics::InputObject,_std::default_delete<helics::InputObject>_> *)
               0x1cdea9);
    this = (shared_ptr<helics::ValueFederate> *)&stack0xffffffffffffff88;
    std::shared_ptr<helics::ValueFederate>::operator=
              (this,(shared_ptr<helics::ValueFederate> *)in_stack_ffffffffffffff28);
    std::shared_ptr<helics::ValueFederate>::~shared_ptr
              ((shared_ptr<helics::ValueFederate> *)0x1cdec9);
    std::unique_ptr<helics::InputObject,_std::default_delete<helics::InputObject>_>::unique_ptr
              ((unique_ptr<helics::InputObject,_std::default_delete<helics::InputObject>_> *)this,
               (unique_ptr<helics::InputObject,_std::default_delete<helics::InputObject>_> *)
               in_stack_ffffffffffffff28);
    local_8 = (pointer)addInput(in_stack_ffffffffffffff90._M_pi,
                                (unique_ptr<helics::InputObject,_std::default_delete<helics::InputObject>_>
                                 *)in_stack_ffffffffffffff88);
    std::unique_ptr<helics::InputObject,_std::default_delete<helics::InputObject>_>::~unique_ptr
              (local_10);
    std::unique_ptr<helics::InputObject,_std::default_delete<helics::InputObject>_>::~unique_ptr
              (local_10);
  }
  else {
    __gnu_cxx::
    __normal_iterator<std::unique_ptr<helics::InputObject,_std::default_delete<helics::InputObject>_>_*,_std::vector<std::unique_ptr<helics::InputObject,_std::default_delete<helics::InputObject>_>,_std::allocator<std::unique_ptr<helics::InputObject,_std::default_delete<helics::InputObject>_>_>_>_>
    ::operator->(&local_30);
    local_8 = std::unique_ptr<helics::InputObject,_std::default_delete<helics::InputObject>_>::get
                        ((unique_ptr<helics::InputObject,_std::default_delete<helics::InputObject>_>
                          *)in_stack_ffffffffffffff30);
  }
  return local_8;
}

Assistant:

HelicsInput findOrCreateInput(HelicsFederate fed, helics::Input& input)
{
    auto* fedObj = reinterpret_cast<helics::FedObject*>(fed);
    const auto handle = input.getHandle();
    auto ind = std::upper_bound(fedObj->inputs.begin(), fedObj->inputs.end(), handle, inputSearch);
    if (ind != fedObj->inputs.end() && (*ind)->inputPtr->getHandle() == handle) {
        HelicsInput hinp = ind->get();
        return hinp;
    }
    auto inp = std::make_unique<helics::InputObject>();
    inp->inputPtr = &input;
    inp->fedptr = getValueFedSharedPtr(fed, nullptr);
    return addInput(fed, std::move(inp));
}